

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_tooltip_begin(nk_context *ctx,float width)

{
  float fVar1;
  nk_window *pnVar2;
  nk_rect rect;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int ret;
  nk_rect bounds;
  nk_input *in;
  nk_window *win;
  int h;
  int w;
  int y;
  int x;
  float width_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x62ed,"int nk_tooltip_begin(struct nk_context *, float)");
  }
  if (ctx->current != (nk_window *)0x0) {
    if (ctx->current->layout != (nk_panel *)0x0) {
      if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
         (ctx->current->layout == (nk_panel *)0x0)) {
        ctx_local._4_4_ = 0;
      }
      else {
        pnVar2 = ctx->current;
        if (((pnVar2->popup).win == (nk_window *)0x0) ||
           (((pnVar2->popup).type &
            (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL)) == NK_PANEL_NONE))
        {
          iVar3 = nk_iceilf(width);
          iVar4 = nk_iceilf(16384.0);
          iVar5 = nk_ifloorf((ctx->input).mouse.pos.x + 1.0);
          fVar1 = (pnVar2->layout->clip).x;
          iVar6 = nk_ifloorf((ctx->input).mouse.pos.y + 1.0);
          rect.y = (float)(iVar6 - (int)(pnVar2->layout->clip).y);
          rect.x = (float)(iVar5 - (int)fVar1);
          rect.w = (float)iVar3;
          rect.h = (float)iVar4;
          ctx_local._4_4_ = nk_popup_begin(ctx,NK_POPUP_DYNAMIC,"__##Tooltip##__",0x21,rect);
          if (ctx_local._4_4_ != 0) {
            pnVar2->layout->flags = pnVar2->layout->flags & 0xffffefff;
          }
          (pnVar2->popup).type = NK_PANEL_TOOLTIP;
          ctx->current->layout->type = NK_PANEL_TOOLTIP;
        }
        else {
          ctx_local._4_4_ = 0;
        }
      }
      return ctx_local._4_4_;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x62ef,"int nk_tooltip_begin(struct nk_context *, float)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x62ee,"int nk_tooltip_begin(struct nk_context *, float)");
}

Assistant:

NK_API int
nk_tooltip_begin(struct nk_context *ctx, float width)
{
    int x,y,w,h;
    struct nk_window *win;
    const struct nk_input *in;
    struct nk_rect bounds;
    int ret;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    /* make sure that no nonblocking popup is currently active */
    win = ctx->current;
    in = &ctx->input;
    if (win->popup.win && (win->popup.type & NK_PANEL_SET_NONBLOCK))
        return 0;

    w = nk_iceilf(width);
    h = nk_iceilf(nk_null_rect.h);
    x = nk_ifloorf(in->mouse.pos.x + 1) - (int)win->layout->clip.x;
    y = nk_ifloorf(in->mouse.pos.y + 1) - (int)win->layout->clip.y;

    bounds.x = (float)x;
    bounds.y = (float)y;
    bounds.w = (float)w;
    bounds.h = (float)h;

    ret = nk_popup_begin(ctx, NK_POPUP_DYNAMIC,
        "__##Tooltip##__", NK_WINDOW_NO_SCROLLBAR|NK_WINDOW_BORDER, bounds);
    if (ret) win->layout->flags &= ~(nk_flags)NK_WINDOW_ROM;
    win->popup.type = NK_PANEL_TOOLTIP;
    ctx->current->layout->type = NK_PANEL_TOOLTIP;
    return ret;
}